

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  GCObject *pGVar4;
  long *plVar5;
  undefined8 *puVar6;
  StkId pTVar7;
  int *piVar8;
  Value *pVVar9;
  int total;
  char *pcVar10;
  long lVar11;
  Value VVar12;
  char buff [40];
  
  pushstr(L,"");
  lVar11 = -0x10;
  total = 2;
  do {
    pcVar3 = strchr(fmt,0x25);
    if (pcVar3 == (char *)0x0) {
      pushstr(L,fmt);
      luaV_concat(L,total,(int)((ulong)((long)L->top - (long)L->base) >> 4) + -1);
      pTVar7 = L->top;
      L->top = (StkId)((long)&pTVar7->value + lVar11);
      return (char *)(*(long *)((long)&pTVar7[-1].value + lVar11) + 0x18);
    }
    pTVar7 = L->top;
    pGVar4 = (GCObject *)luaS_newlstr(L,fmt,(long)pcVar3 - (long)fmt);
    (pTVar7->value).gc = pGVar4;
    pTVar7->tt = 4;
    pTVar7 = L->top;
    if ((long)L->stack_last - (long)pTVar7 < 0x11) {
      luaD_growstack(L,1);
      pTVar7 = L->top;
    }
    L->top = pTVar7 + 1;
    cVar1 = pcVar3[1];
    if (cVar1 == '%') {
      pushstr(L,"%");
    }
    else if (cVar1 == 'c') {
      uVar2 = argp->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        pcVar10 = (char *)((ulong)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        pcVar10 = (char *)argp->overflow_arg_area;
        argp->overflow_arg_area = pcVar10 + 8;
      }
      buff[0] = *pcVar10;
      buff[1] = '\0';
LAB_0010485d:
      pcVar10 = buff;
LAB_00104865:
      pushstr(L,pcVar10);
    }
    else {
      if (cVar1 == 'd') {
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          piVar8 = (int *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          piVar8 = (int *)argp->overflow_arg_area;
          argp->overflow_arg_area = piVar8 + 2;
        }
        VVar12.n = (lua_Number)*piVar8;
      }
      else {
        if (cVar1 != 'f') {
          if (cVar1 == 'p') {
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              puVar6 = (undefined8 *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              puVar6 = (undefined8 *)argp->overflow_arg_area;
              argp->overflow_arg_area = puVar6 + 1;
            }
            pcVar10 = buff;
            sprintf(pcVar10,"%p",*puVar6);
          }
          else {
            if (cVar1 != 's') {
              buff[0] = '%';
              buff[2] = '\0';
              buff[1] = cVar1;
              goto LAB_0010485d;
            }
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              plVar5 = (long *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              plVar5 = (long *)argp->overflow_arg_area;
              argp->overflow_arg_area = plVar5 + 1;
            }
            pcVar10 = (char *)*plVar5;
            if (pcVar10 == (char *)0x0) {
              pcVar10 = "(null)";
            }
          }
          goto LAB_00104865;
        }
        uVar2 = argp->fp_offset;
        if ((ulong)uVar2 < 0xa1) {
          pVVar9 = (Value *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->fp_offset = uVar2 + 0x10;
        }
        else {
          pVVar9 = (Value *)argp->overflow_arg_area;
          argp->overflow_arg_area = pVVar9 + 1;
        }
        VVar12 = *pVVar9;
      }
      pTVar7[1].value = VVar12;
      pTVar7[1].tt = 3;
      pTVar7 = L->top;
      if ((long)L->stack_last - (long)pTVar7 < 0x11) {
        luaD_growstack(L,1);
        pTVar7 = L->top;
      }
      L->top = pTVar7 + 1;
    }
    fmt = pcVar3 + 2;
    lVar11 = lVar11 + -0x20;
    total = total + 2;
  } while( true );
}

Assistant:

static const char*luaO_pushvfstring(lua_State*L,const char*fmt,va_list argp){
int n=1;
pushstr(L,"");
for(;;){
const char*e=strchr(fmt,'%');
if(e==NULL)break;
setsvalue(L,L->top,luaS_newlstr(L,fmt,e-fmt));
incr_top(L);
switch(*(e+1)){
case's':{
const char*s=va_arg(argp,char*);
if(s==NULL)s="(null)";
pushstr(L,s);
break;
}
case'c':{
char buff[2];
buff[0]=cast(char,va_arg(argp,int));
buff[1]='\0';
pushstr(L,buff);
break;
}
case'd':{
setnvalue(L->top,cast_num(va_arg(argp,int)));
incr_top(L);
break;
}
case'f':{
setnvalue(L->top,cast_num(va_arg(argp,l_uacNumber)));
incr_top(L);
break;
}
case'p':{
char buff[4*sizeof(void*)+8];
sprintf(buff,"%p",va_arg(argp,void*));
pushstr(L,buff);
break;
}
case'%':{
pushstr(L,"%");
break;
}
default:{
char buff[3];
buff[0]='%';
buff[1]=*(e+1);
buff[2]='\0';
pushstr(L,buff);
break;
}
}
n+=2;
fmt=e+2;
}
pushstr(L,fmt);
luaV_concat(L,n+1,cast_int(L->top-L->base)-1);
L->top-=n;
return svalue(L->top-1);
}